

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlSkipBlankChars(xmlParserCtxtPtr ctxt)

{
  int *piVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  xmlParserInputPtr pxVar5;
  byte *pbVar6;
  byte *pbVar7;
  int res;
  int iVar8;
  
  iVar8 = 0;
  do {
    pbVar6 = ctxt->input->cur;
    pbVar7 = pbVar6;
    do {
      bVar4 = *pbVar7;
      if (bVar4 < 0xd) {
        if (bVar4 == 9) goto LAB_001320f7;
        if (bVar4 != 10) goto LAB_0013212c;
        pxVar5 = ctxt->input;
        piVar1 = &pxVar5->line;
        *piVar1 = *piVar1 + 1;
        pxVar5->col = 1;
      }
      else {
        if ((bVar4 != 0xd) && (bVar4 != 0x20)) {
LAB_0013212c:
          pxVar5 = ctxt->input;
          pxVar5->cur = pbVar7;
          if (((4 < iVar8) && ((pxVar5->flags & 0x40) == 0)) &&
             ((long)pxVar5->end - (long)pbVar6 < 0xfa)) {
            xmlParserGrow(ctxt);
          }
          return iVar8;
        }
LAB_001320f7:
        piVar1 = &ctxt->input->col;
        *piVar1 = *piVar1 + 1;
      }
      pbVar2 = pbVar7 + 1;
      if (iVar8 != 0x7fffffff) {
        iVar8 = iVar8 + 1;
      }
      pbVar6 = pbVar6 + 1;
      pbVar3 = pbVar7 + 1;
      pbVar7 = pbVar2;
    } while (*pbVar3 != 0);
    ctxt->input->cur = pbVar2;
    xmlParserGrow(ctxt);
  } while( true );
}

Assistant:

int
xmlSkipBlankChars(xmlParserCtxtPtr ctxt) {
    const xmlChar *cur;
    int res = 0;

    cur = ctxt->input->cur;
    while (IS_BLANK_CH(*cur)) {
        if (*cur == '\n') {
            ctxt->input->line++; ctxt->input->col = 1;
        } else {
            ctxt->input->col++;
        }
        cur++;
        if (res < INT_MAX)
            res++;
        if (*cur == 0) {
            ctxt->input->cur = cur;
            xmlParserGrow(ctxt);
            cur = ctxt->input->cur;
        }
    }
    ctxt->input->cur = cur;

    if (res > 4)
        GROW;

    return(res);
}